

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O0

void __thiscall mjs::anon_unknown_46::stringify_state::nest::~nest(nest *this)

{
  nest *this_local;
  
  pop(this->state_);
  std::__cxx11::wstring::operator=((wstring *)&this->state_->indent_,(wstring *)&this->step_back_);
  std::__cxx11::wstring::~wstring((wstring *)&this->step_back_);
  return;
}

Assistant:

~nest() {
            state_.pop();
            state_.indent_ = step_back_;
        }